

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeString::toUTF8
          (UnicodeString *this,int32_t start,int32_t len,char *target,int32_t capacity)

{
  UErrorCode destCapacity;
  char *dest;
  char16_t *pcVar1;
  UErrorCode local_2c;
  int32_t local_28;
  UErrorCode errorCode;
  int32_t length8;
  int32_t capacity_local;
  char *target_local;
  int32_t len_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  errorCode = capacity;
  _length8 = target;
  target_local._0_4_ = len;
  target_local._4_4_ = start;
  _len_local = this;
  pinIndices(this,(int32_t *)((long)&target_local + 4),(int32_t *)&target_local);
  dest = _length8;
  destCapacity = errorCode;
  local_2c = U_ZERO_ERROR;
  pcVar1 = getBuffer(this);
  u_strToUTF8WithSub_63
            (dest,destCapacity,&local_28,pcVar1 + target_local._4_4_,(int32_t)target_local,0xfffd,
             (int32_t *)0x0,&local_2c);
  return local_28;
}

Assistant:

int32_t
UnicodeString::toUTF8(int32_t start, int32_t len,
                      char *target, int32_t capacity) const {
  pinIndices(start, len);
  int32_t length8;
  UErrorCode errorCode = U_ZERO_ERROR;
  u_strToUTF8WithSub(target, capacity, &length8,
                     getBuffer() + start, len,
                     0xFFFD,  // Standard substitution character.
                     NULL,    // Don't care about number of substitutions.
                     &errorCode);
  return length8;
}